

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

string * __thiscall
runtime::VirtualMachine::variableToString_abi_cxx11_
          (string *__return_storage_ptr__,VirtualMachine *this,Variable var,bool panic)

{
  char *__s;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d [19];
  allocator<char> local_2a;
  undefined1 local_29;
  VirtualMachine *pVStack_28;
  bool panic_local;
  VirtualMachine *this_local;
  Variable var_local;
  
  var_local._0_8_ = var.field_1;
  this_local._0_4_ = var.type;
  local_29 = panic;
  pVStack_28 = this;
  var_local.field_1.stringValue = __return_storage_ptr__;
  switch((VariableType)this_local) {
  case Undefined:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"undefined",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    break;
  case Integer:
    std::__cxx11::to_string(__return_storage_ptr__,var_local._0_8_);
    break;
  case Boolean:
    __s = "false";
    if (((undefined1  [16])var & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      __s = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_3f);
    std::allocator<char>::~allocator(&local_3f);
    break;
  case Float:
    std::__cxx11::to_string(__return_storage_ptr__,(double)var_local._0_8_);
    break;
  case String:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)var_local._0_8_);
    break;
  case Object:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<object>",local_3d);
    std::allocator<char>::~allocator(local_3d);
    break;
  case Function:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<function>",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  default:
    if (panic) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"Unknown varible type at variableToString",&local_61);
      VirtualMachine::panic(this,&local_60);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UKNOWN!",&local_62);
    std::allocator<char>::~allocator(&local_62);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VirtualMachine::variableToString(Variable var, bool panic) {
  switch (var.type) {
    case VariableType::Integer: {
      return std::to_string(var.integerValue);
    }
    case VariableType::Float: {
      return std::to_string(var.doubleValue);
    }
    case VariableType::Function: {
      return "<function>";
    }
    case VariableType::Object: {
      return "<object>";
    }
    case VariableType::String: {
      return *var.stringValue;
    }
    case VariableType::Undefined: {
      return "undefined";
    }
    case VariableType::Boolean: {
      return var.boolValue ? "true" : "false";
    }
    default: {
      if (panic) {
        this->panic("Unknown varible type at variableToString");
      } else {
        return "UKNOWN!";
      }
    }
  }
}